

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

void computeSaltAndRootSeed
               (uint8_t *saltAndRoot,size_t saltAndRootLength,uint8_t *privateKey,uint8_t *pubKey,
               uint8_t *plaintext,uint8_t *message,size_t messageByteLength,
               picnic_instance_t *params)

{
  hash_context ctx;
  undefined6 in_stack_fffffffffffffee8;
  uint16_t in_stack_fffffffffffffeee;
  hash_context *in_stack_fffffffffffffef0;
  
  hash_init(in_stack_fffffffffffffef0,CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8))
  ;
  hash_update(in_stack_fffffffffffffef0,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x14765f);
  hash_update(in_stack_fffffffffffffef0,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x147679);
  hash_update(in_stack_fffffffffffffef0,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x147699);
  hash_update(in_stack_fffffffffffffef0,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x1476b9);
  hash_update_uint16_le(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
  hash_final((hash_context *)0x1476d8);
  hash_squeeze(in_stack_fffffffffffffef0,
               (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x1476f2);
  return;
}

Assistant:

static void computeSaltAndRootSeed(uint8_t* saltAndRoot, size_t saltAndRootLength,
                                   const uint8_t* privateKey, const uint8_t* pubKey,
                                   const uint8_t* plaintext, const uint8_t* message,
                                   size_t messageByteLength, const picnic_instance_t* params) {
  hash_context ctx;

  hash_init(&ctx, params->digest_size);
  hash_update(&ctx, privateKey, params->input_output_size);
  hash_update(&ctx, message, messageByteLength);
  hash_update(&ctx, pubKey, params->input_output_size);
  hash_update(&ctx, plaintext, params->input_output_size);
  hash_update_uint16_le(&ctx, (uint16_t)params->lowmc.n);
  hash_final(&ctx);
  hash_squeeze(&ctx, saltAndRoot, saltAndRootLength);
  hash_clear(&ctx);
}